

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O1

void QGuiApplicationPrivate::processSafeAreaMarginsChangedEvent(SafeAreaMarginsChangedEvent *wse)

{
  Data *pDVar1;
  QObject *pQVar2;
  QWindow *this;
  long in_FS_OFFSET;
  QMargins _t1;
  undefined1 *local_28;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (wse->window).wp.d;
  if (((pDVar1 != (Data *)0x0) && ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i != 0))
     && ((wse->window).wp.value != (QObject *)0x0)) {
    if ((pDVar1 == (Data *)0x0) || ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0)
       ) {
      this = (QWindow *)0x0;
    }
    else {
      this = (QWindow *)(wse->window).wp.value;
    }
    _t1 = QWindow::safeAreaMargins((QWindow *)(wse->window).wp.value);
    QWindow::safeAreaMarginsChanged(this,_t1);
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_28,SafeAreaMarginsChange);
    pDVar1 = (wse->window).wp.d;
    if ((pDVar1 == (Data *)0x0) || ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0)
       ) {
      pQVar2 = (QObject *)0x0;
    }
    else {
      pQVar2 = (wse->window).wp.value;
    }
    QCoreApplication::sendSpontaneousEvent(pQVar2,(QEvent *)&local_28);
    QEvent::~QEvent((QEvent *)&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGuiApplicationPrivate::processSafeAreaMarginsChangedEvent(QWindowSystemInterfacePrivate::SafeAreaMarginsChangedEvent *wse)
{
    if (wse->window.isNull())
        return;

    emit wse->window->safeAreaMarginsChanged(wse->window->safeAreaMargins());

    QEvent event(QEvent::SafeAreaMarginsChange);
    QGuiApplication::sendSpontaneousEvent(wse->window, &event);
}